

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sparse_basic.c
# Opt level: O0

void verify_sparse_file(archive *a,char *path,sparse *sparse,int blocks)

{
  int iVar1;
  void **buff_00;
  int in_ECX;
  archive_entry *in_RDI;
  int hole;
  int data_blocks;
  int64_t total;
  int64_t offset;
  size_t bytes_read;
  void *buff;
  archive_entry *ae;
  sparse *in_stack_000003b8;
  char *in_stack_000003c0;
  void *in_stack_ffffffffffffff98;
  archive_entry *entry;
  int64_t *o;
  archive *in_stack_ffffffffffffffa0;
  archive *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  int iVar2;
  wchar_t in_stack_ffffffffffffffb4;
  wchar_t line;
  char *in_stack_ffffffffffffffb8;
  char *file;
  undefined8 local_40;
  undefined8 local_38;
  void *in_stack_ffffffffffffffd0;
  
  create_sparse_file(in_stack_000003c0,in_stack_000003b8);
  archive_entry_new();
  assertion_assert((char *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                   (wchar_t)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
                   (wchar_t)in_stack_ffffffffffffffa8,(char *)in_stack_ffffffffffffffa0,
                   in_stack_ffffffffffffff98);
  archive_read_disk_open(in_stack_ffffffffffffffa8,(char *)in_stack_ffffffffffffffa0);
  entry = in_RDI;
  assertion_equal_int(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,
                      (longlong)in_stack_ffffffffffffffa8,(char *)in_stack_ffffffffffffffa0,
                      (longlong)in_RDI,(char *)0x1c9837,in_stack_ffffffffffffffd0);
  archive_read_next_header2(in_stack_ffffffffffffffa0,entry);
  assertion_equal_int(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,
                      (longlong)in_stack_ffffffffffffffa8,(char *)in_stack_ffffffffffffffa0,
                      (longlong)in_RDI,(char *)0x1c9875,in_stack_ffffffffffffffd0);
  buff_00 = (void **)(long)in_ECX;
  archive_entry_sparse_count
            ((archive_entry *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  o = (int64_t *)0x0;
  assertion_equal_int(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,(longlong)buff_00,
                      (char *)in_stack_ffffffffffffffa0,0,(char *)0x1c98ba,in_stack_ffffffffffffffd0
                     );
  file = (char *)0x0;
  line = L'\0';
  iVar2 = 0;
  while( true ) {
    iVar1 = archive_read_data_block
                      ((archive *)CONCAT44(line,iVar2),buff_00,(size_t *)in_stack_ffffffffffffffa0,o
                      );
    if (iVar1 != 0) break;
    if (((long)file < local_40) || (local_40 == 0)) {
      if ((long)file < local_40) {
        iVar2 = 1;
      }
      line = line + L'\x01';
    }
    file = (char *)(local_40 + local_38);
  }
  if ((iVar2 == 0) && (line == L'\x01')) {
    line = L'\0';
  }
  assertion_equal_int(file,line,(longlong)buff_00,(char *)in_stack_ffffffffffffffa0,0,
                      (char *)0x1c9981,in_stack_ffffffffffffffd0);
  archive_read_close((archive *)0x1c998b);
  assertion_equal_int(file,line,(longlong)buff_00,(char *)in_stack_ffffffffffffffa0,(longlong)in_RDI
                      ,(char *)0x1c99ba,in_stack_ffffffffffffffd0);
  archive_entry_free((archive_entry *)0x1c99c4);
  return;
}

Assistant:

static void
verify_sparse_file(struct archive *a, const char *path,
    const struct sparse *sparse, int blocks)
{
	struct archive_entry *ae;
	const void *buff;
	size_t bytes_read;
	int64_t offset;
	int64_t total;
	int data_blocks, hole;

	create_sparse_file(path, sparse);
	assert((ae = archive_entry_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_disk_open(a, path));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header2(a, ae));
	/* Verify the number of holes only, not its offset nor its
	 * length because those alignments are deeply dependence on
	 * its filesystem. */ 
	assertEqualInt(blocks, archive_entry_sparse_count(ae));
	total = 0;
	data_blocks = 0;
	hole = 0;
	while (ARCHIVE_OK == archive_read_data_block(a, &buff, &bytes_read,
	    &offset)) {
		if (offset > total || offset == 0) {
			if (offset > total)
				hole = 1;
			data_blocks++;
		}
		total = offset + bytes_read;
	}
	if (!hole && data_blocks == 1)
		data_blocks = 0;/* There are no holes */
	assertEqualInt(blocks, data_blocks);

	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	archive_entry_free(ae);
}